

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yang.c
# Opt level: O1

int yang_read_pattern(lys_module *module,lys_restr *pattern,char *value,char modifier)

{
  int iVar1;
  size_t sVar2;
  char *pcVar3;
  LY_ERR *pLVar4;
  
  iVar1 = lyp_check_pattern(value,(pcre **)0x0);
  if (iVar1 == 0) {
    sVar2 = strlen(value);
    pcVar3 = (char *)malloc(sVar2 + 2);
    if (pcVar3 != (char *)0x0) {
      *pcVar3 = modifier;
      strcpy(pcVar3 + 1,value);
      free(value);
      pcVar3 = lydict_insert_zc(module->ctx,pcVar3);
      pattern->expr = pcVar3;
      return 0;
    }
    pLVar4 = ly_errno_location();
    *pLVar4 = LY_EMEM;
    ly_log(LY_LLERR,"Memory allocation failed (%s()).","yang_read_pattern");
  }
  free(value);
  return 1;
}

Assistant:

int
yang_read_pattern(struct lys_module *module, struct lys_restr *pattern, char *value, char modifier)
{
    char *buf;
    size_t len;

    if (lyp_check_pattern(value, NULL)) {
        free(value);
        return EXIT_FAILURE;
    }

    len = strlen(value);
    buf = malloc((len + 2) * sizeof *buf); /* modifier byte + value + terminating NULL byte */

    if (!buf) {
        LOGMEM;
        free(value);
        return EXIT_FAILURE;
    }

    buf[0] = modifier;
    strcpy(&buf[1], value);
    free(value);

    pattern->expr = lydict_insert_zc(module->ctx, buf);
    return EXIT_SUCCESS;
}